

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  bool bVar10;
  int local_7c;
  uint local_78;
  secp256k1_scalar s;
  
  if (wnaf == (int *)0x0) {
    pcVar8 = "test condition failed: wnaf != NULL";
    uVar6 = 0xa9;
  }
  else if (a == (secp256k1_scalar *)0x0) {
    pcVar8 = "test condition failed: a != NULL";
    uVar6 = 0xab;
  }
  else {
    if (1 < w) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < len) {
        uVar5 = (ulong)(uint)len;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        wnaf[uVar4] = 0;
      }
      s.d[0] = a->d[0];
      s.d[1] = a->d[1];
      s.d[2] = a->d[2];
      s.d[3] = a->d[3];
      local_7c = 1;
      uVar1 = secp256k1_scalar_get_bits_limb32(&s,0xff,1);
      if (uVar1 != 0) {
        secp256k1_scalar_negate(&s,&s);
        local_7c = -1;
      }
      iVar7 = 0;
      uVar1 = 0;
      local_78 = 0xffffffff;
      do {
        uVar4 = (ulong)iVar7;
        iVar7 = len - iVar7;
        while( true ) {
          uVar9 = (uint)uVar4;
          if (len <= (int)uVar9) {
            if (uVar1 == 0) {
              do {
                uVar9 = (uint)uVar4;
                if (0xff < (int)uVar9) {
                  return local_78 + 1;
                }
                uVar1 = secp256k1_scalar_get_bits_limb32(&s,uVar9,1);
                uVar4 = (ulong)(uVar9 + 1);
              } while (uVar1 == 0);
              pcVar8 = 
              "test condition failed: secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0";
              uVar6 = 0xd7;
            }
            else {
              pcVar8 = "test condition failed: carry == 0";
              uVar6 = 0xd4;
            }
            goto LAB_001346a1;
          }
          uVar2 = secp256k1_scalar_get_bits_limb32(&s,uVar9,1);
          if (uVar2 != uVar1) break;
          uVar4 = uVar4 + 1;
          iVar7 = iVar7 + -1;
        }
        uVar3 = len - uVar9;
        if (w <= (int)(len - uVar9)) {
          uVar3 = w;
        }
        uVar2 = secp256k1_scalar_get_bits_var(&s,uVar9,uVar3);
        uVar3 = uVar2 + uVar1;
        bVar10 = (uVar3 >> (w - 1U & 0x1f) & 1) != 0;
        uVar1 = (uint32_t)bVar10;
        wnaf[uVar4] = (uVar3 - ((uint)bVar10 << ((byte)w & 0x1f))) * local_7c;
        if (w < iVar7) {
          iVar7 = w;
        }
        iVar7 = iVar7 + uVar9;
        local_78 = uVar9;
      } while( true );
    }
    pcVar8 = "test condition failed: 2 <= w && w <= 31";
    uVar6 = 0xac;
  }
LAB_001346a1:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/ecmult_impl.h"
          ,uVar6,pcVar8);
  abort();
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}